

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  int32_t iVar33;
  fpclass_type fVar34;
  int32_t iVar35;
  int iVar36;
  int iVar37;
  IdxElement *pIVar38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  fpclass_type *pfVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  long lVar54;
  int iVar55;
  uint uVar56;
  ulong uVar57;
  type t;
  cpp_dec_float<100U,_int,_void> local_4c0;
  IdxElement local_470;
  IdxElement local_41c;
  IdxElement local_3c8;
  IdxElement local_374;
  IdxElement local_320;
  IdxElement local_2cc;
  cpp_dec_float<100U,_int,_void> local_278;
  IdxElement local_228;
  IdxElement local_1d4;
  IdxElement local_180;
  IdxElement local_12c;
  IdxElement local_d8;
  IdxElement local_84;
  ulong uVar53;
  
  uVar46 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar51 = end - 1;
    uVar53 = (ulong)uVar51;
    uVar42 = uVar51 - start;
    if (0x18 < (int)uVar42) {
LAB_004609bd:
      uVar51 = (uint)uVar46;
      iVar43 = (uVar42 >> 1) + uVar51;
      pIVar1 = keys + iVar43;
      pIVar38 = keys + iVar43;
      pnVar39 = &pIVar38->val;
      iVar43 = pIVar38->idx;
      uVar10 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xc);
      uVar11 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xe);
      uVar12 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 8);
      uVar13 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 10);
      uVar14 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)(pnVar39->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 2);
      iVar6 = (pIVar38->val).m_backend.exp;
      bVar4 = (pIVar38->val).m_backend.neg;
      fVar7 = (pIVar38->val).m_backend.fpclass;
      iVar8 = (pIVar38->val).m_backend.prec_elem;
      lVar40 = (long)(int)uVar51;
      uVar52 = (uint)uVar53;
      lVar41 = (long)(int)uVar52;
      uVar49 = uVar46;
      uVar57 = uVar53;
      do {
        iVar37 = (int)uVar49;
        iVar55 = (int)uVar57;
        uVar50 = uVar49;
        if ((type & 1U) == 0) {
          if (iVar37 < (int)uVar52) {
            pfVar45 = &keys[iVar37].val.m_backend.fpclass;
            do {
              local_12c.idx = pfVar45[-0x13];
              local_12c.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar45 + -0x12))->data)._M_elems;
              local_12c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar45 + -0x10);
              local_12c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar45 + -0xe);
              local_12c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar45 + -0xc);
              local_12c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar45 + -10);
              local_12c.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar45 + -8);
              local_12c.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar45 + -6);
              local_12c.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar45 + -4);
              local_12c.val.m_backend.exp = pfVar45[-2];
              local_12c.val.m_backend.neg = *(bool *)(pfVar45 + -1);
              local_12c.val.m_backend._72_8_ = *(undefined8 *)pfVar45;
              local_374.idx = iVar43;
              local_374.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_374.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_374.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_374.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_374.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_374.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_374.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_374.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_374.val.m_backend.exp = iVar6;
              local_374.val.m_backend.neg = bVar4;
              local_374.val.m_backend.fpclass = fVar7;
              local_374.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_12c,&local_374);
              uVar50 = uVar49;
              if (local_4c0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar37 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (0 < iVar37) break;
              uVar42 = (int)uVar49 + 1;
              uVar49 = (ulong)uVar42;
              pfVar45 = pfVar45 + 0x15;
              uVar50 = uVar53;
            } while (uVar52 != uVar42);
          }
          if ((int)uVar51 < iVar55) {
            uVar57 = (ulong)iVar55;
            pfVar45 = &keys[uVar57].val.m_backend.fpclass;
            do {
              local_180.idx = pfVar45[-0x13];
              local_180.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar45 + -0x12))->data)._M_elems;
              local_180.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar45 + -0x10);
              local_180.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar45 + -0xe);
              local_180.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar45 + -0xc);
              local_180.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar45 + -10);
              local_180.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar45 + -8);
              local_180.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar45 + -6);
              local_180.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar45 + -4);
              local_180.val.m_backend.exp = pfVar45[-2];
              local_180.val.m_backend.neg = *(bool *)(pfVar45 + -1);
              local_180.val.m_backend._72_8_ = *(undefined8 *)pfVar45;
              local_3c8.idx = iVar43;
              local_3c8.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_3c8.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_3c8.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_3c8.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_3c8.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_3c8.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_3c8.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_3c8.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_3c8.val.m_backend.exp = iVar6;
              local_3c8.val.m_backend.neg = bVar4;
              local_3c8.val.m_backend.fpclass = fVar7;
              local_3c8.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_180,&local_3c8);
              if (local_4c0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar37 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (iVar37 < 1) break;
              uVar57 = uVar57 - 1;
              pfVar45 = pfVar45 + -0x15;
            } while (lVar40 < (long)uVar57);
          }
        }
        else {
          if (iVar37 < (int)uVar52) {
            pfVar45 = &keys[iVar37].val.m_backend.fpclass;
            lVar54 = 0;
            do {
              local_84.idx = pfVar45[-0x13];
              local_84.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar45 + -0x12))->data)._M_elems;
              local_84.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar45 + -0x10);
              local_84.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar45 + -0xe);
              local_84.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar45 + -0xc);
              local_84.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar45 + -10);
              local_84.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar45 + -8);
              local_84.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar45 + -6);
              local_84.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar45 + -4);
              local_84.val.m_backend.exp = pfVar45[-2];
              local_84.val.m_backend.neg = *(bool *)(pfVar45 + -1);
              local_84.val.m_backend._72_8_ = *(undefined8 *)pfVar45;
              local_2cc.idx = iVar43;
              local_2cc.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_2cc.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_2cc.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_2cc.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_2cc.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_2cc.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_2cc.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_2cc.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_2cc.val.m_backend.exp = iVar6;
              local_2cc.val.m_backend.neg = bVar4;
              local_2cc.val.m_backend.fpclass = fVar7;
              local_2cc.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_84,&local_2cc);
              if (local_4c0.fpclass == cpp_dec_float_NaN) {
                uVar50 = (ulong)(uint)(iVar37 - (int)lVar54);
                break;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (-1 < iVar36) {
                uVar50 = (ulong)(uint)(iVar37 - (int)lVar54);
                break;
              }
              lVar54 = lVar54 + -1;
              pfVar45 = pfVar45 + 0x15;
              uVar50 = uVar53;
            } while (iVar37 - lVar41 != lVar54);
          }
          if ((int)uVar51 < iVar55) {
            uVar57 = (ulong)iVar55;
            pfVar45 = &keys[uVar57].val.m_backend.fpclass;
            do {
              local_d8.idx = pfVar45[-0x13];
              local_d8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)(pfVar45 + -0x12))->data)._M_elems;
              local_d8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar45 + -0x10);
              local_d8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar45 + -0xe);
              local_d8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar45 + -0xc);
              local_d8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar45 + -10);
              local_d8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar45 + -8);
              local_d8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar45 + -6);
              local_d8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar45 + -4);
              local_d8.val.m_backend.exp = pfVar45[-2];
              local_d8.val.m_backend.neg = *(bool *)(pfVar45 + -1);
              local_d8.val.m_backend._72_8_ = *(undefined8 *)pfVar45;
              local_320.idx = iVar43;
              local_320.val.m_backend.data._M_elems._0_8_ = uVar16;
              local_320.val.m_backend.data._M_elems._8_8_ = uVar17;
              local_320.val.m_backend.data._M_elems._16_8_ = uVar14;
              local_320.val.m_backend.data._M_elems._24_8_ = uVar15;
              local_320.val.m_backend.data._M_elems._32_8_ = uVar12;
              local_320.val.m_backend.data._M_elems._40_8_ = uVar13;
              local_320.val.m_backend.data._M_elems._48_8_ = uVar10;
              local_320.val.m_backend.data._M_elems._56_8_ = uVar11;
              local_320.val.m_backend.exp = iVar6;
              local_320.val.m_backend.neg = bVar4;
              local_320.val.m_backend.fpclass = fVar7;
              local_320.val.m_backend.prec_elem = iVar8;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_4c0,compare,&local_d8,&local_320);
              if (local_4c0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_278,0,(type *)0x0);
              iVar37 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_4c0,&local_278);
              if (iVar37 < 0) break;
              uVar57 = uVar57 - 1;
              pfVar45 = pfVar45 + -0x15;
            } while (lVar40 < (long)uVar57);
          }
        }
        iVar37 = (int)uVar50;
        iVar55 = (int)uVar57;
        if (iVar55 <= iVar37) goto LAB_00461142;
        iVar36 = keys[iVar37].idx;
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 0xc;
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 8;
        uVar20 = *(undefined8 *)puVar2;
        uVar21 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 4;
        uVar22 = *(undefined8 *)puVar2;
        uVar23 = *(undefined8 *)(puVar2 + 2);
        uVar24 = *(undefined8 *)keys[iVar37].val.m_backend.data._M_elems;
        uVar25 = *(undefined8 *)(keys[iVar37].val.m_backend.data._M_elems + 2);
        iVar9 = keys[iVar37].val.m_backend.exp;
        bVar5 = keys[iVar37].val.m_backend.neg;
        keys[iVar37].idx = keys[iVar55].idx;
        uVar26 = *(undefined8 *)keys[iVar55].val.m_backend.data._M_elems;
        uVar27 = *(undefined8 *)(keys[iVar55].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar55].val.m_backend.data._M_elems + 4;
        uVar28 = *(undefined8 *)puVar2;
        uVar29 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar55].val.m_backend.data._M_elems + 8;
        uVar30 = *(undefined8 *)puVar2;
        uVar31 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar55].val.m_backend.data._M_elems + 0xc;
        uVar32 = *(undefined8 *)(puVar2 + 2);
        puVar3 = keys[iVar37].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
        *(undefined8 *)(puVar3 + 2) = uVar32;
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar30;
        *(undefined8 *)(puVar2 + 2) = uVar31;
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar28;
        *(undefined8 *)(puVar2 + 2) = uVar29;
        *(undefined8 *)keys[iVar37].val.m_backend.data._M_elems = uVar26;
        *(undefined8 *)(keys[iVar37].val.m_backend.data._M_elems + 2) = uVar27;
        keys[iVar37].val.m_backend.exp = keys[iVar55].val.m_backend.exp;
        keys[iVar37].val.m_backend.neg = keys[iVar55].val.m_backend.neg;
        keys[iVar55].idx = iVar36;
        *(undefined8 *)keys[iVar55].val.m_backend.data._M_elems = uVar24;
        *(undefined8 *)(keys[iVar55].val.m_backend.data._M_elems + 2) = uVar25;
        puVar2 = keys[iVar55].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar22;
        *(undefined8 *)(puVar2 + 2) = uVar23;
        puVar2 = keys[iVar55].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar20;
        *(undefined8 *)(puVar2 + 2) = uVar21;
        puVar2 = keys[iVar55].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar18;
        *(undefined8 *)(puVar2 + 2) = uVar19;
        keys[iVar55].val.m_backend.exp = iVar9;
        keys[iVar55].val.m_backend.neg = bVar5;
        fVar34 = keys[iVar37].val.m_backend.fpclass;
        iVar35 = keys[iVar37].val.m_backend.prec_elem;
        iVar33 = keys[iVar55].val.m_backend.prec_elem;
        keys[iVar37].val.m_backend.fpclass = keys[iVar55].val.m_backend.fpclass;
        keys[iVar37].val.m_backend.prec_elem = iVar33;
        keys[iVar55].val.m_backend.fpclass = fVar34;
        keys[iVar55].val.m_backend.prec_elem = iVar35;
        uVar49 = (ulong)(iVar37 + 1);
        uVar57 = (ulong)(iVar55 - 1);
      } while( true );
    }
LAB_0046165e:
    if (0 < (int)uVar42) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar51,compare,start);
    }
  }
  return;
LAB_00461142:
  if ((type & 1U) == 0) {
    if ((int)uVar51 < iVar55) {
      uVar57 = (ulong)iVar55;
      pfVar45 = &keys[uVar57].val.m_backend.fpclass;
      do {
        local_228.idx = pfVar45[-0x13];
        local_228.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar45 + -0x12))->data)._M_elems;
        local_228.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar45 + -0x10);
        local_228.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar45 + -0xe);
        local_228.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar45 + -0xc);
        local_228.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar45 + -10);
        local_228.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar45 + -8);
        local_228.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar45 + -6);
        local_228.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar45 + -4);
        local_228.val.m_backend.exp = pfVar45[-2];
        local_228.val.m_backend.neg = *(bool *)(pfVar45 + -1);
        local_228.val.m_backend._72_8_ = *(undefined8 *)pfVar45;
        local_470.idx = iVar43;
        local_470.val.m_backend.data._M_elems._0_8_ = uVar16;
        local_470.val.m_backend.data._M_elems._8_8_ = uVar17;
        local_470.val.m_backend.data._M_elems._16_8_ = uVar14;
        local_470.val.m_backend.data._M_elems._24_8_ = uVar15;
        local_470.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_470.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_470.val.m_backend.data._M_elems._48_8_ = uVar10;
        local_470.val.m_backend.data._M_elems._56_8_ = uVar11;
        local_470.val.m_backend.exp = iVar6;
        local_470.val.m_backend.neg = bVar4;
        local_470.val.m_backend.fpclass = fVar7;
        local_470.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c0,compare,&local_470,&local_228);
        if (local_4c0.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_278,0,(type *)0x0);
        iVar37 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4c0,&local_278);
        if (0 < iVar37) break;
        uVar57 = uVar57 - 1;
        pfVar45 = pfVar45 + -0x15;
      } while (lVar40 < (long)uVar57);
    }
    if ((uint)uVar57 == uVar52) {
      iVar43 = keys[lVar41].idx;
      puVar2 = keys[lVar41].val.m_backend.data._M_elems + 0xc;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar41].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar41].val.m_backend.data._M_elems + 4;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      uVar16 = *(undefined8 *)keys[lVar41].val.m_backend.data._M_elems;
      uVar17 = *(undefined8 *)(keys[lVar41].val.m_backend.data._M_elems + 2);
      iVar6 = keys[lVar41].val.m_backend.exp;
      bVar4 = keys[lVar41].val.m_backend.neg;
      keys[lVar41].idx = pIVar1->idx;
      uVar18 = *(undefined8 *)(pnVar39->m_backend).data._M_elems;
      uVar19 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 4);
      uVar21 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 6);
      uVar22 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 8);
      uVar23 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 10);
      uVar24 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xe);
      puVar2 = keys[lVar41].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar2 + 2) = uVar24;
      puVar2 = keys[lVar41].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar22;
      *(undefined8 *)(puVar2 + 2) = uVar23;
      puVar2 = keys[lVar41].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      *(undefined8 *)keys[lVar41].val.m_backend.data._M_elems = uVar18;
      *(undefined8 *)(keys[lVar41].val.m_backend.data._M_elems + 2) = uVar19;
      keys[lVar41].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[lVar41].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar43;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 8) = uVar12;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 10) = uVar13;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 4) = uVar14;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 6) = uVar15;
      *(undefined8 *)(pnVar39->m_backend).data._M_elems = uVar16;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 2) = uVar17;
      (pIVar1->val).m_backend.exp = iVar6;
      (pIVar1->val).m_backend.neg = bVar4;
      fVar7 = keys[lVar41].val.m_backend.fpclass;
      iVar33 = keys[lVar41].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[lVar41].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[lVar41].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar33;
      uVar57 = (ulong)(uVar52 - 1);
    }
  }
  else {
    uVar49 = uVar50;
    if (iVar37 < (int)uVar52) {
      pfVar45 = &keys[iVar37].val.m_backend.fpclass;
      do {
        local_1d4.idx = pfVar45[-0x13];
        local_1d4.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar45 + -0x12))->data)._M_elems;
        local_1d4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar45 + -0x10);
        local_1d4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar45 + -0xe);
        local_1d4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar45 + -0xc);
        local_1d4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar45 + -10);
        local_1d4.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar45 + -8);
        local_1d4.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar45 + -6);
        local_1d4.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar45 + -4);
        local_1d4.val.m_backend.exp = pfVar45[-2];
        local_1d4.val.m_backend.neg = *(bool *)(pfVar45 + -1);
        local_1d4.val.m_backend._72_8_ = *(undefined8 *)pfVar45;
        local_41c.idx = iVar43;
        local_41c.val.m_backend.data._M_elems._0_8_ = uVar16;
        local_41c.val.m_backend.data._M_elems._8_8_ = uVar17;
        local_41c.val.m_backend.data._M_elems._16_8_ = uVar14;
        local_41c.val.m_backend.data._M_elems._24_8_ = uVar15;
        local_41c.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_41c.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_41c.val.m_backend.data._M_elems._48_8_ = uVar10;
        local_41c.val.m_backend.data._M_elems._56_8_ = uVar11;
        local_41c.val.m_backend.exp = iVar6;
        local_41c.val.m_backend.neg = bVar4;
        local_41c.val.m_backend.fpclass = fVar7;
        local_41c.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c0,compare,&local_41c,&local_1d4);
        uVar49 = uVar50;
        if (local_4c0.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_278,0,(type *)0x0);
        iVar37 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4c0,&local_278);
        if (iVar37 < 0) break;
        uVar42 = (int)uVar50 + 1;
        uVar50 = (ulong)uVar42;
        pfVar45 = pfVar45 + 0x15;
        uVar49 = uVar53;
      } while (uVar52 != uVar42);
    }
    uVar50 = uVar49;
    if ((uint)uVar49 == uVar51) {
      iVar43 = keys[lVar40].idx;
      puVar2 = keys[lVar40].val.m_backend.data._M_elems + 0xc;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar40].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar40].val.m_backend.data._M_elems + 4;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      uVar16 = *(undefined8 *)keys[lVar40].val.m_backend.data._M_elems;
      uVar17 = *(undefined8 *)(keys[lVar40].val.m_backend.data._M_elems + 2);
      iVar6 = keys[lVar40].val.m_backend.exp;
      bVar4 = keys[lVar40].val.m_backend.neg;
      keys[lVar40].idx = pIVar1->idx;
      uVar18 = *(undefined8 *)(pnVar39->m_backend).data._M_elems;
      uVar19 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 4);
      uVar21 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 6);
      uVar22 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 8);
      uVar23 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 10);
      uVar24 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xe);
      puVar2 = keys[lVar40].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar2 + 2) = uVar24;
      puVar2 = keys[lVar40].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar22;
      *(undefined8 *)(puVar2 + 2) = uVar23;
      puVar2 = keys[lVar40].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      *(undefined8 *)keys[lVar40].val.m_backend.data._M_elems = uVar18;
      *(undefined8 *)(keys[lVar40].val.m_backend.data._M_elems + 2) = uVar19;
      keys[lVar40].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[lVar40].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar43;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 8) = uVar12;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 10) = uVar13;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 4) = uVar14;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 6) = uVar15;
      *(undefined8 *)(pnVar39->m_backend).data._M_elems = uVar16;
      *(undefined8 *)((pIVar38->val).m_backend.data._M_elems + 2) = uVar17;
      (pIVar1->val).m_backend.exp = iVar6;
      (pIVar1->val).m_backend.neg = bVar4;
      fVar7 = keys[lVar40].val.m_backend.fpclass;
      iVar33 = keys[lVar40].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[lVar40].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[lVar40].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar33;
      uVar50 = (ulong)(uVar51 + 1);
    }
  }
  uVar56 = (uint)uVar57;
  uVar42 = uVar56 - uVar51;
  uVar47 = (uint)uVar50;
  uVar44 = uVar52 - uVar47;
  if ((int)uVar44 < (int)uVar42) {
    uVar53 = uVar57 & 0xffffffff;
    uVar44 = uVar42;
    uVar56 = uVar52;
    uVar48 = uVar51;
    uVar51 = uVar47;
    if ((int)uVar52 <= (int)uVar47) goto LAB_00461643;
  }
  else {
    uVar46 = uVar50;
    uVar42 = uVar44;
    uVar48 = uVar47;
    if ((int)uVar56 <= (int)uVar51) goto LAB_00461643;
  }
  SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar56 + 1,compare,uVar51,(bool)(~type & 1));
  uVar46 = (ulong)uVar48;
  uVar42 = uVar44;
LAB_00461643:
  uVar51 = (uint)uVar53;
  start = (int)uVar46;
  type = (bool)(type ^ 1);
  if ((int)uVar42 < 0x19) goto LAB_0046165e;
  goto LAB_004609bd;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}